

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ConflictPoolPropagation::markPropagateConflict
          (ConflictPoolPropagation *this,HighsInt conflict)

{
  byte *pbVar1;
  int local_14;
  
  if ((this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[conflict] < 2) {
    local_14 = conflict;
    std::vector<int,_std::allocator<int>_>::push_back(&this->propagateConflictInds_,&local_14);
    pbVar1 = (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start + local_14;
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::markPropagateConflict(
    HighsInt conflict) {
  if (conflictFlag_[conflict] < 2) {
    propagateConflictInds_.push_back(conflict);
    conflictFlag_[conflict] |= 4;
  }
}